

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_c.cpp
# Opt level: O2

spvc_result spvc_compiler_create_shader_resources(spvc_compiler compiler,spvc_resources *resources)

{
  spvc_context_s *psVar1;
  bool bVar2;
  spvc_result sVar3;
  spvc_resources_s *this;
  _Head_base<0UL,_ScratchMemoryAllocation_*,_false> local_1a90 [5];
  string local_1a68;
  string local_1a48;
  ShaderResources accessed_resources;
  
  this = (spvc_resources_s *)operator_new(0xe10,(nothrow_t *)&std::nothrow);
  if (this == (spvc_resources_s *)0x0) {
    psVar1 = compiler->context;
    std::__cxx11::string::string
              ((string *)&local_1a48,"Out of memory.",(allocator *)&accessed_resources);
    spvc_context_s::report_error(psVar1,&local_1a48);
    std::__cxx11::string::~string((string *)&local_1a48);
    sVar3 = SPVC_ERROR_OUT_OF_MEMORY;
  }
  else {
    spvc_resources_s::spvc_resources_s(this);
    this->context = compiler->context;
    spirv_cross::Compiler::get_shader_resources
              (&accessed_resources,
               (compiler->compiler)._M_t.
               super___uniq_ptr_impl<spirv_cross::Compiler,_std::default_delete<spirv_cross::Compiler>_>
               ._M_t.
               super__Tuple_impl<0UL,_spirv_cross::Compiler_*,_std::default_delete<spirv_cross::Compiler>_>
               .super__Head_base<0UL,_spirv_cross::Compiler_*,_false>._M_head_impl);
    bVar2 = spvc_resources_s::copy_resources(this,&accessed_resources);
    if (bVar2) {
      *resources = this;
      local_1a90[0]._M_head_impl = (ScratchMemoryAllocation *)this;
      spirv_cross::
      SmallVector<std::unique_ptr<ScratchMemoryAllocation,_std::default_delete<ScratchMemoryAllocation>_>,_8UL>
      ::push_back(&compiler->context->allocations,
                  (unique_ptr<ScratchMemoryAllocation,_std::default_delete<ScratchMemoryAllocation>_>
                   *)local_1a90);
      if ((spvc_resources_s *)local_1a90[0]._M_head_impl != (spvc_resources_s *)0x0) {
        (*((ScratchMemoryAllocation *)&(local_1a90[0]._M_head_impl)->_vptr_ScratchMemoryAllocation)
          ->_vptr_ScratchMemoryAllocation[1])();
      }
      this = (spvc_resources_s *)0x0;
    }
    else {
      psVar1 = this->context;
      std::__cxx11::string::string((string *)&local_1a68,"Out of memory.",(allocator *)local_1a90);
      spvc_context_s::report_error(psVar1,&local_1a68);
      std::__cxx11::string::~string((string *)&local_1a68);
    }
    spirv_cross::ShaderResources::~ShaderResources(&accessed_resources);
    if (this != (spvc_resources_s *)0x0) {
      (*(this->super_ScratchMemoryAllocation)._vptr_ScratchMemoryAllocation[1])(this);
    }
    sVar3 = (uint)bVar2 + (uint)bVar2 * 2 + SPVC_ERROR_OUT_OF_MEMORY;
  }
  return sVar3;
}

Assistant:

spvc_result spvc_compiler_create_shader_resources(spvc_compiler compiler, spvc_resources *resources)
{
	SPVC_BEGIN_SAFE_SCOPE
	{
		std::unique_ptr<spvc_resources_s> res(new (std::nothrow) spvc_resources_s);
		if (!res)
		{
			compiler->context->report_error("Out of memory.");
			return SPVC_ERROR_OUT_OF_MEMORY;
		}

		res->context = compiler->context;
		auto accessed_resources = compiler->compiler->get_shader_resources();

		if (!res->copy_resources(accessed_resources))
		{
			res->context->report_error("Out of memory.");
			return SPVC_ERROR_OUT_OF_MEMORY;
		}

		*resources = res.get();
		compiler->context->allocations.push_back(std::move(res));
	}